

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::~Generator(Generator *this)

{
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__Generator_0019bbc8;
  std::__cxx11::string::~string((string *)&this->file_descriptor_serialized_);
  google::protobuf::internal::Mutex::~Mutex(&this->mutex_);
  CodeGenerator::~CodeGenerator(&this->super_CodeGenerator);
  return;
}

Assistant:

Generator::~Generator() {
}